

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_backend_timeout(uv_loop_t *loop)

{
  long in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(int *)(in_RDI + 0x30) == 0) {
    if ((*(int *)(in_RDI + 8) == 0) && (in_RDI + 0x20 == *(long *)(in_RDI + 0x20))) {
      iVar1 = 0;
    }
    else if (in_RDI + 0x148 == *(long *)(in_RDI + 0x148)) {
      if (*(long *)(in_RDI + 0x110) == 0) {
        iVar1 = uv__next_timeout((uv_loop_t *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
      else {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int uv_backend_timeout(const uv_loop_t* loop) {
  if (loop->stop_flag != 0)
    return 0;

  if (!uv__has_active_handles(loop) && !uv__has_active_reqs(loop))
    return 0;

  if (!QUEUE_EMPTY(&loop->idle_handles))
    return 0;

  if (loop->closing_handles)
    return 0;

  return uv__next_timeout(loop);
}